

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  CallLogWrapper *this_00;
  pointer str;
  pointer *ppfVar1;
  pointer *this_01;
  uint uVar2;
  TestLog *pTVar3;
  pointer pBVar4;
  ulong uVar5;
  DataType scalarType;
  pointer pVVar6;
  GLint location;
  int iVar7;
  uint size;
  DataType DVar8;
  deUint32 dVar9;
  GLenum GVar10;
  long lVar11;
  const_iterator cVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  int iVar16;
  undefined8 extraout_RDX;
  undefined8 uVar17;
  VarValue *value;
  VarValue *value_00;
  undefined8 extraout_RDX_00;
  uint uVar18;
  GLsizei GVar19;
  VarValue *pVVar20;
  DataType *pDVar21;
  ulong uVar22;
  long lVar23;
  int i;
  ulong uVar24;
  uint uVar25;
  byte bVar26;
  float fVar27;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  string curName;
  undefined1 local_2c8 [72];
  VarValue apiValue;
  string local_238;
  string queryName;
  VarValue local_1f8;
  vector<float,_std::allocator<float>_> buffer;
  
  bVar26 = 0;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar2 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
  scalarType = TYPE_INT;
  if ((uVar2 & 0x20) == 0) {
    scalarType = TYPE_FLOAT;
  }
  this_00 = &this->super_CallLogWrapper;
  lVar23 = 0;
  do {
    pBVar4 = (basicUniforms->
             super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)(basicUniforms->
                   super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4;
    if ((int)(lVar11 / 0x98) <= lVar23) {
      return;
    }
    str = pBVar4 + lVar23;
    iVar16 = pBVar4[lVar23].elemNdx;
    if ((((this->super_CallLogWrapper).field_0x14 & 0x80) == 0) || (iVar16 != 0)) {
      std::__cxx11::string::string((string *)&queryName,(string *)str);
      uVar18 = 1;
      if (-1 < iVar16) goto LAB_00ed438c;
LAB_00ed43c8:
      location = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,programGL,queryName._M_dataplus._M_p);
      iVar7 = glu::getDataTypeScalarSize(str->type);
      uVar25 = 0;
      bVar15 = false;
      if (((this->super_CallLogWrapper).field_0x14 & 2) != 0) {
        bVar15 = uVar18 == 1 &&
                 (str->type - TYPE_INT < 0xfffffff7 && str->type - TYPE_DOUBLE < 0xfffffff7);
      }
      valuesToAssign.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      valuesToAssign.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      valuesToAssign.
      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar17 = extraout_RDX;
      if ((int)uVar18 < 1) {
        uVar18 = uVar25;
      }
      for (; pVVar6 = valuesToAssign.
                      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                      ._M_impl.super__Vector_impl_data._M_start, uVar25 != uVar18;
          uVar25 = uVar25 + 1) {
        if (iVar16 < 0) {
          std::__cxx11::string::string((string *)&curName,(string *)str);
          pVVar20 = &str->finalValue;
LAB_00ed455e:
          pDVar21 = (DataType *)local_2c8;
          for (lVar11 = 0x11; lVar11 != 0; lVar11 = lVar11 + -1) {
            *pDVar21 = pVVar20->type;
            pVVar20 = (VarValue *)((long)pVVar20 + (ulong)bVar26 * -8 + 4);
            pDVar21 = pDVar21 + (ulong)bVar26 * -2 + 1;
          }
          if (local_2c8._0_4_ - TYPE_BOOL < 4) {
            size = glu::getDataTypeScalarSize(local_2c8._0_4_);
            DVar8 = scalarType;
            if (size != 1) {
              DVar8 = glu::getDataTypeVector(scalarType,size);
            }
            if ((int)size < 1) {
              size = 0;
            }
            apiValue.type = DVar8;
            if ((uVar2 & 0x20) == 0) {
              for (uVar24 = 0; size != uVar24; uVar24 = uVar24 + 1) {
                if (local_2c8[uVar24 + 4] == '\x01') {
                  fVar27 = deRandom_getFloat(&rnd->m_rnd);
                  fVar27 = fVar27 * 20.0 + -10.0;
                  *(float *)((long)&apiValue.val + uVar24 * 4) = fVar27;
                  if ((fVar27 == 0.0) && (!NAN(fVar27))) {
                    *(undefined4 *)((long)&apiValue.val + uVar24 * 4) = 0x3f800000;
                  }
                }
                else {
                  *(undefined4 *)((long)&apiValue.val + uVar24 * 4) = 0;
                }
              }
            }
            else {
              for (uVar24 = 0; size != uVar24; uVar24 = uVar24 + 1) {
                if (local_2c8[uVar24 + 4] == '\x01') {
                  dVar9 = deRandom_getUint32(&rnd->m_rnd);
                  *(uint *)((long)&apiValue.val + uVar24 * 4) =
                       (dVar9 % 0x15 - 10) + (uint)(dVar9 % 0x15 == 10);
                }
                else {
                  *(undefined4 *)((long)&apiValue.val + uVar24 * 4) = 0;
                }
              }
            }
          }
          else if (local_2c8._0_4_ - TYPE_SAMPLER_1D < 0x1e) {
            apiValue.type = TYPE_INT;
            apiValue.val.floatV[0] = (float)local_2c8._4_4_;
          }
          else {
            pDVar21 = (DataType *)local_2c8;
            pVVar20 = &apiValue;
            for (lVar11 = 0x11; lVar11 != 0; lVar11 = lVar11 + -1) {
              pVVar20->type = *pDVar21;
              pDVar21 = pDVar21 + (ulong)bVar26 * -2 + 1;
              pVVar20 = (VarValue *)((long)pVVar20 + (ulong)bVar26 * -8 + 4);
            }
          }
          std::
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          ::push_back(&valuesToAssign,&apiValue);
          ppfVar1 = &buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          this_01 = &buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          if (str->type - TYPE_BOOL < 4) {
            buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)pTVar3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar1);
            std::operator<<((ostream *)ppfVar1,"// Using type ");
            pcVar13 = glu::getDataTypeName(scalarType);
            std::operator<<((ostream *)ppfVar1,pcVar13);
            std::operator<<((ostream *)ppfVar1," to set boolean value ");
            apiVarValueStr_abi_cxx11_((string *)&local_1f8,(Functional *)local_2c8,value);
            std::operator<<((ostream *)ppfVar1,(string *)&local_1f8);
            std::operator<<((ostream *)ppfVar1," for ");
            std::operator<<((ostream *)ppfVar1,(string *)&curName);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_1f8);
          }
          else {
            if (0x1d < str->type - TYPE_SAMPLER_1D) goto LAB_00ed47db;
            buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)pTVar3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
            std::operator<<((ostream *)this_01,"// Texture for the sampler uniform ");
            std::operator<<((ostream *)this_01,(string *)&curName);
            std::operator<<((ostream *)this_01," will be filled with color ");
            getSamplerFillValue(&local_1f8,&str->finalValue);
            apiVarValueStr_abi_cxx11_(&local_238,(Functional *)&local_1f8,value_00);
            std::operator<<((ostream *)this_01,(string *)&local_238);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_238);
          }
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)
                     &buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
        }
        else {
          beforeLast((string *)&apiValue,&str->rootName,(char)uVar17);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &apiValue,"[");
          local_238._M_dataplus._M_p._0_4_ = str->elemNdx + uVar25;
          de::toString<int>((string *)&local_1f8,(int *)&local_238);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1f8);
          std::operator+(&curName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&buffer,"]");
          std::__cxx11::string::~string((string *)&buffer);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)local_2c8);
          std::__cxx11::string::~string((string *)&apiValue);
          cVar12 = BasicUniform::findWithName(basicUniforms,curName._M_dataplus._M_p);
          if (cVar12._M_current !=
              (basicUniforms->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            pVVar20 = &(cVar12._M_current)->finalValue;
            goto LAB_00ed455e;
          }
        }
LAB_00ed47db:
        std::__cxx11::string::~string((string *)&curName);
        uVar17 = extraout_RDX_00;
      }
      DVar8 = (valuesToAssign.
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
               ._M_impl.super__Vector_impl_data._M_start)->type;
      lVar11 = (long)iVar7;
      if (DVar8 - TYPE_FLOAT < 4) {
        if (bVar15) {
          switch(iVar7) {
          case 1:
            glu::CallLogWrapper::glUniform1f
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x60a;
            pcVar13 = "glUniform1f(location, ptr[0])";
            break;
          case 2:
            glu::CallLogWrapper::glUniform2f
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x60b;
            pcVar13 = "glUniform2f(location, ptr[0], ptr[1])";
            break;
          case 3:
            glu::CallLogWrapper::glUniform3f
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x60c;
            pcVar13 = "glUniform3f(location, ptr[0], ptr[1], ptr[2])";
            break;
          case 4:
            glu::CallLogWrapper::glUniform4f
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).floatV[3]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x60d;
            pcVar13 = "glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3])";
            break;
          default:
            goto switchD_00ed4879_default;
          }
          glu::checkError(dVar9,pcVar13,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,iVar16);
          goto switchD_00ed4879_default;
        }
        lVar14 = ((long)valuesToAssign.
                        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)valuesToAssign.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x44;
        std::vector<float,_std::allocator<float>_>::vector
                  (&buffer,lVar11 * lVar14,(allocator_type *)local_2c8);
        uVar24 = (ulong)((long)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        uVar22 = uVar24 & 0xffffffff;
        if ((int)uVar24 < 1) {
          uVar22 = 0;
        }
        for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
          uVar5 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
          buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar24] =
               pVVar6[(int)((long)uVar5 / (long)iVar7)].val.floatV
               [(long)uVar5 % (long)iVar7 & 0xffffffff];
        }
        GVar19 = (GLsizei)lVar14;
        switch(iVar7) {
        case 1:
          glu::CallLogWrapper::glUniform1fv
                    (this_00,location,GVar19,
                     buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x61b;
          pcVar13 = "glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 2:
          glu::CallLogWrapper::glUniform2fv
                    (this_00,location,GVar19,
                     buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x61c;
          pcVar13 = "glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 3:
          glu::CallLogWrapper::glUniform3fv
                    (this_00,location,GVar19,
                     buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x61d;
          pcVar13 = "glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 4:
          glu::CallLogWrapper::glUniform4fv
                    (this_00,location,GVar19,
                     buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x61e;
          pcVar13 = "glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        default:
          goto switchD_00ed4afa_default;
        }
        glu::checkError(dVar9,pcVar13,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                        ,iVar16);
switchD_00ed4afa_default:
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&buffer.super__Vector_base<float,_std::allocator<float>_>);
      }
      else {
        if (DVar8 - TYPE_FLOAT_MAT2 < 9 || DVar8 - TYPE_DOUBLE_MAT2 < 9) {
          lVar14 = ((long)valuesToAssign.
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x44;
          std::vector<float,_std::allocator<float>_>::vector
                    (&buffer,lVar11 * lVar14,(allocator_type *)local_2c8);
          uVar24 = (ulong)((long)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2;
          uVar22 = uVar24 & 0xffffffff;
          if ((int)uVar24 < 1) {
            uVar22 = 0;
          }
          for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
            uVar5 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
            buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar24] =
                 pVVar6[(int)((long)uVar5 / (long)iVar7)].val.floatV
                 [(long)uVar5 % (long)iVar7 & 0xffffffff];
          }
          DVar8 = str->type;
          GVar19 = (GLsizei)lVar14;
          if (DVar8 == TYPE_FLOAT_MAT2) {
            glu::CallLogWrapper::glUniformMatrix2fv
                      (this_00,location,GVar19,'\0',
                       buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x62e;
            pcVar13 = 
            "glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
          }
          else if (DVar8 == TYPE_FLOAT_MAT3) {
            glu::CallLogWrapper::glUniformMatrix3fv
                      (this_00,location,GVar19,'\0',
                       buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x62f;
            pcVar13 = 
            "glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
          }
          else {
            if (DVar8 != TYPE_FLOAT_MAT4) goto switchD_00ed4afa_default;
            glu::CallLogWrapper::glUniformMatrix4fv
                      (this_00,location,GVar19,'\0',
                       buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x630;
            pcVar13 = 
            "glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
          }
          glu::checkError(dVar9,pcVar13,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,iVar16);
          goto switchD_00ed4afa_default;
        }
        if (3 < DVar8 - TYPE_INT) {
          if (DVar8 - TYPE_SAMPLER_1D < 0x1e) {
            if (bVar15) {
              glu::CallLogWrapper::glUniform1i(this_00,location,(str->finalValue).val.intV[0]);
              GVar10 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar10,"glUniform1i(location, uniform.finalValue.val.samplerV.unit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x65a);
            }
            else {
              buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(buffer.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (str->finalValue).val.intV[0]);
              glu::CallLogWrapper::glUniform1iv
                        (this_00,location,
                         (GLsizei)(((long)valuesToAssign.
                                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)valuesToAssign.
                                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x44),
                         (GLint *)&buffer);
              GVar10 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar10,"glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x65e);
            }
          }
          goto switchD_00ed4879_default;
        }
        if (bVar15) {
          switch(iVar7) {
          case 1:
            glu::CallLogWrapper::glUniform1i
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x63d;
            pcVar13 = "glUniform1i(location, ptr[0])";
            break;
          case 2:
            glu::CallLogWrapper::glUniform2i
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[1]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x63e;
            pcVar13 = "glUniform2i(location, ptr[0], ptr[1])";
            break;
          case 3:
            glu::CallLogWrapper::glUniform3i
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[2]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x63f;
            pcVar13 = "glUniform3i(location, ptr[0], ptr[1], ptr[2])";
            break;
          case 4:
            glu::CallLogWrapper::glUniform4i
                      (this_00,location,
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[2],
                       ((valuesToAssign.
                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).intV[3]);
            dVar9 = glu::CallLogWrapper::glGetError(this_00);
            iVar16 = 0x640;
            pcVar13 = "glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3])";
            break;
          default:
            goto switchD_00ed4879_default;
          }
          glu::checkError(dVar9,pcVar13,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,iVar16);
          goto switchD_00ed4879_default;
        }
        lVar14 = ((long)valuesToAssign.
                        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)valuesToAssign.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x44;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&buffer,lVar11 * lVar14,
                   (allocator_type *)local_2c8);
        uVar24 = (ulong)((long)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        uVar22 = uVar24 & 0xffffffff;
        if ((int)uVar24 < 1) {
          uVar22 = 0;
        }
        for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
          uVar5 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
          buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar24] =
               pVVar6[(int)((long)uVar5 / (long)iVar7)].val.floatV
               [(long)uVar5 % (long)iVar7 & 0xffffffff];
        }
        GVar19 = (GLsizei)lVar14;
        switch(iVar7) {
        case 1:
          glu::CallLogWrapper::glUniform1iv
                    (this_00,location,GVar19,
                     (GLint *)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x64e;
          pcVar13 = "glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 2:
          glu::CallLogWrapper::glUniform2iv
                    (this_00,location,GVar19,
                     (GLint *)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x64f;
          pcVar13 = "glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 3:
          glu::CallLogWrapper::glUniform3iv
                    (this_00,location,GVar19,
                     (GLint *)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x650;
          pcVar13 = "glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        case 4:
          glu::CallLogWrapper::glUniform4iv
                    (this_00,location,GVar19,
                     (GLint *)buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
          dVar9 = glu::CallLogWrapper::glGetError(this_00);
          iVar16 = 0x651;
          pcVar13 = "glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
          break;
        default:
          goto switchD_00ed4c80_default;
        }
        glu::checkError(dVar9,pcVar13,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                        ,iVar16);
switchD_00ed4c80_default:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&buffer);
      }
switchD_00ed4879_default:
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::~vector(&valuesToAssign);
    }
    else {
      beforeLast(&queryName,&str->name,(char)(lVar11 % 0x98));
LAB_00ed438c:
      uVar25 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
      if ((uVar25 & 4) == 0) {
        uVar18 = 1;
        if ((uVar25 & 8) != 0) {
          uVar18 = ~str->elemNdx * 2 & 2;
          goto LAB_00ed43c0;
        }
        goto LAB_00ed43c8;
      }
      if (str->elemNdx == 0) {
        uVar18 = str->rootSize;
LAB_00ed43c0:
        if (uVar18 != 0) goto LAB_00ed43c8;
      }
      ppfVar1 = &buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar1);
      std::operator<<((ostream *)ppfVar1,"// Uniform ");
      std::operator<<((ostream *)ppfVar1,(string *)str);
      std::operator<<((ostream *)ppfVar1,
                      " is covered by another glUniform*v() call to the same array");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar1);
    }
    std::__cxx11::string::~string((string *)&queryName);
    lVar23 = lVar23 + 1;
  } while( true );
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1f(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2f(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3f(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2: GLU_CHECK_CALL(glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3: GLU_CHECK_CALL(glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4: GLU_CHECK_CALL(glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1i(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2i(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3i(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glUniform1i(location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}